

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SStream.c
# Opt level: O0

void SStream_concat0(SStream *ss,char *s)

{
  size_t sVar1;
  char *in_RSI;
  long in_RDI;
  uint len;
  
  sVar1 = strlen(in_RSI);
  memcpy((void *)(in_RDI + *(int *)(in_RDI + 0x200)),in_RSI,sVar1 & 0xffffffff);
  *(int *)(in_RDI + 0x200) = (int)sVar1 + *(int *)(in_RDI + 0x200);
  *(undefined1 *)(in_RDI + *(int *)(in_RDI + 0x200)) = 0;
  return;
}

Assistant:

void SStream_concat0(SStream *ss, const char *s)
{
#ifndef CAPSTONE_DIET
	unsigned int len = (unsigned int) strlen(s);

	memcpy(ss->buffer + ss->index, s, len);
	ss->index += len;
	ss->buffer[ss->index] = '\0';
#endif
}